

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossSiteObject.h
# Opt level: O2

BOOL __thiscall
Js::CrossSiteObject<Js::WebAssemblyMemory>::GetAccessors
          (CrossSiteObject<Js::WebAssemblyMemory> *this,PropertyId propertyId,Var *getter,
          Var *setter,ScriptContext *requestContext)

{
  BOOL BVar1;
  Var pvVar2;
  
  BVar1 = DynamicObject::GetAccessors((DynamicObject *)this,propertyId,getter,setter,requestContext)
  ;
  if (BVar1 != 0) {
    if (*getter != (Var)0x0) {
      pvVar2 = CrossSite::MarshalVar(requestContext,*getter,false);
      *getter = pvVar2;
    }
    if (*setter != (Var)0x0) {
      pvVar2 = CrossSite::MarshalVar(requestContext,*setter,false);
      *setter = pvVar2;
    }
  }
  return BVar1;
}

Assistant:

BOOL CrossSiteObject<T>::GetAccessors(PropertyId propertyId, _Outptr_result_maybenull_ Var* getter, _Outptr_result_maybenull_ Var* setter, ScriptContext * requestContext)
    {
        BOOL result = __super::GetAccessors(propertyId, getter, setter, requestContext);
        if (result)
        {
            if (*getter != nullptr)
            {
                *getter = CrossSite::MarshalVar(requestContext, *getter);
            }
            if (*setter != nullptr)
            {
                *setter = CrossSite::MarshalVar(requestContext, *setter);
            }
        }
        return result;
    }